

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O1

Iterator __thiscall
Imf_3_4::IDManifest::ChannelGroupManifest::find(ChannelGroupManifest *this,uint64_t idValue)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  iterator iVar3;
  
  iVar2._M_node = &(this->_table)._M_t._M_impl.super__Rb_tree_header._M_header;
  iVar3._M_node = iVar2._M_node;
  for (p_Var1 = (this->_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[*(ulong *)(p_Var1 + 1) < idValue]) {
    if (*(ulong *)(p_Var1 + 1) >= idValue) {
      iVar3._M_node = p_Var1;
    }
  }
  if ((iVar3._M_node != iVar2._M_node) && (*(ulong *)(iVar3._M_node + 1) <= idValue)) {
    iVar2._M_node = iVar3._M_node;
  }
  return (Iterator)iVar2._M_node;
}

Assistant:

IDManifest::ChannelGroupManifest::Iterator
IDManifest::ChannelGroupManifest::find (uint64_t idValue)
{
    return IDManifest::ChannelGroupManifest::Iterator (_table.find (idValue));
}